

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

Gia_Man_t *
Gia_ManAreaBalance(Gia_Man_t *p,int fSimpleAnd,int nNewNodesMax,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Vec_Flt_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Gia_Man_t *pGVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  
  if (p->vCiArrs == (Vec_Int_t *)0x0) {
    pVVar2 = p->vInArrs;
    if (pVVar2 != (Vec_Flt_t *)0x0) {
      if (p->And2Delay == 0) {
        fVar12 = 1.0;
      }
      else {
        fVar12 = (float)p->And2Delay;
      }
      pVVar6 = p->vCis;
      if (0 < pVVar6->nSize) {
        piVar7 = pVVar6->pArray;
        lVar11 = 0;
        do {
          iVar5 = piVar7[lVar11];
          if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_006fefac;
          if (iVar5 == 0) break;
          if (pVVar2->nSize <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          if (p->vLevels->nSize <= iVar5) goto LAB_006fefcb;
          p->vLevels->pArray[iVar5] = (int)(pVVar2->pArray[lVar11] / fVar12);
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar6->nSize);
      }
    }
  }
  else {
    iVar5 = p->And2Delay;
    if (p->vLevels != (Vec_Int_t *)0x0) {
      piVar7 = p->vLevels->pArray;
      if (piVar7 != (int *)0x0) {
        free(piVar7);
        p->vLevels->pArray = (int *)0x0;
      }
      if (p->vLevels != (Vec_Int_t *)0x0) {
        free(p->vLevels);
        p->vLevels = (Vec_Int_t *)0x0;
      }
    }
    iVar1 = p->nObjs;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    iVar10 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar10 = iVar1;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar10;
    if (iVar10 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      piVar7 = (int *)malloc((long)iVar10 << 2);
    }
    pVVar6->pArray = piVar7;
    pVVar6->nSize = iVar1;
    if (piVar7 != (int *)0x0) {
      memset(piVar7,0,(long)iVar1 << 2);
    }
    p->vLevels = pVVar6;
    pVVar3 = p->vCis;
    if (0 < pVVar3->nSize) {
      piVar4 = pVVar3->pArray;
      lVar11 = 0;
      do {
        iVar1 = piVar4[lVar11];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_006fefac:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (iVar1 == 0) break;
        if (p->vCiArrs->nSize <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (pVVar6->nSize <= iVar1) {
LAB_006fefcb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar7[iVar1] = p->vCiArrs->pArray[lVar11] / (int)(iVar5 + (uint)(iVar5 == 0));
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar3->nSize);
    }
  }
  if ((p->pManTime != (void *)0x0) && (p->vLevels == (Vec_Int_t *)0x0)) {
    Gia_ManLevelWithBoxes(p);
  }
  pVVar6 = Gia_ManGetCiLevels(p);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    pGVar8 = Gia_ManDup(p);
  }
  else {
    pGVar8 = (Gia_Man_t *)Dsm_ManDeriveGia(p,0);
  }
  Gia_ManTransferTiming(pGVar8,p);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar8,(Gps_Par_t *)0x0);
  }
  if (fSimpleAnd == 0) {
    pGVar9 = Gia_ManDupMuxes(pGVar8,2);
  }
  else {
    pGVar9 = Gia_ManDup(pGVar8);
  }
  Gia_ManTransferTiming(pGVar9,pGVar8);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar9,(Gps_Par_t *)0x0);
  }
  if (pGVar8 != p) {
    Gia_ManStop(pGVar8);
  }
  pGVar8 = Dam_ManAreaBalanceInt(pGVar9,pVVar6,nNewNodesMax,fVerbose,fVeryVerbose);
  Gia_ManTransferTiming(pGVar8,pGVar9);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar8,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar9);
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (int *)0x0;
    }
    free(pVVar6);
  }
  pGVar9 = Gia_ManDupNoMuxes(pGVar8,0);
  Gia_ManTransferTiming(pGVar9,pGVar8);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar9,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar8);
  iVar5 = Gia_ManIsNormalized(pGVar9);
  pGVar8 = pGVar9;
  if (iVar5 == 0) {
    pGVar8 = Gia_ManDupNormalize(pGVar9,0);
    Gia_ManTransferTiming(pGVar8,pGVar9);
    Gia_ManStop(pGVar9);
  }
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManAreaBalance( Gia_Man_t * p, int fSimpleAnd, int nNewNodesMax, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew0, * pNew, * pNew1, * pNew2;
    Vec_Int_t * vCiLevels;
    // set arrival times for the input of the new AIG
    if ( p->vCiArrs )
    {
        int i, Id, And2Delay = p->And2Delay ? p->And2Delay : 1;
        Vec_IntFreeP( &p->vLevels );
        p->vLevels = Vec_IntStart( Gia_ManObjNum(p) );
        Gia_ManForEachCiId( p, Id, i )
            Vec_IntWriteEntry( p->vLevels, Id, Vec_IntEntry(p->vCiArrs, i)/And2Delay );
    }
    else if ( p->vInArrs )
    {
        int i, Id, And2Delay = p->And2Delay ? p->And2Delay : 1;
        Gia_ManForEachCiId( p, Id, i )
            Vec_IntWriteEntry( p->vLevels, Id, (int)(Vec_FltEntry(p->vInArrs, i)/And2Delay) );
    }
    // determine CI levels
    if ( p->pManTime && p->vLevels == NULL )
        Gia_ManLevelWithBoxes( p );
    vCiLevels = Gia_ManGetCiLevels( p );
    // get the starting manager
    pNew0 = Gia_ManHasMapping(p) ? (Gia_Man_t *)Dsm_ManDeriveGia(p, 0) : Gia_ManDup(p);
    Gia_ManTransferTiming( pNew0, p );
    if ( fVerbose )     Gia_ManPrintStats( pNew0, NULL );
    // derive internal manager
    pNew = fSimpleAnd ? Gia_ManDup( pNew0 ) : Gia_ManDupMuxes( pNew0, 2 );
    Gia_ManTransferTiming( pNew, pNew0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pNew0 != p ) Gia_ManStop( pNew0 );
    // perform the operation
    pNew1 = Dam_ManAreaBalanceInt( pNew, vCiLevels, nNewNodesMax, fVerbose, fVeryVerbose );
    Gia_ManTransferTiming( pNew1, pNew );
    if ( fVerbose )     Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    Vec_IntFreeP( &vCiLevels );
    // derive the final result
    pNew2 = Gia_ManDupNoMuxes( pNew1, 0 );
    Gia_ManTransferTiming( pNew2, pNew1 );
    if ( fVerbose )     Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    // normalize if needed
    if ( !Gia_ManIsNormalized(pNew2) )
    {
        pNew2 = Gia_ManDupNormalize( pNew1 = pNew2, 0 );
        Gia_ManTransferTiming( pNew2, pNew1 );
        Gia_ManStop( pNew1 );
    }
    //Gia_ManTransferTiming( pNew2, p );
    return pNew2;
}